

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O3

void __thiscall
JetHead::list<Timer::TimerNode>::push_back(list<Timer::TimerNode> *this,TimerNode *val)

{
  Node *pNVar1;
  Node *pNVar2;
  TimerListener *pTVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Node *this_00;
  
  this_00 = (Node *)operator_new(0x38,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                 ,0xa7);
  (this_00->val).mEvent.mObj = (Event *)0x0;
  SmartPtr<Event>::operator=((SmartPtr<Event> *)this_00,(val->mEvent).mObj);
  pTVar3 = val->mListener;
  uVar4 = val->mPrivateData;
  uVar5 = val->mTick;
  uVar6 = val->mRepeatMS;
  uVar7 = val->mRemainingMS;
  (this_00->val).mDispatcher = val->mDispatcher;
  (this_00->val).mListener = pTVar3;
  (this_00->val).mPrivateData = uVar4;
  (this_00->val).mTick = uVar5;
  (this_00->val).mRepeatMS = uVar6;
  (this_00->val).mRemainingMS = uVar7;
  pNVar1 = this->mTail;
  pNVar2 = pNVar1->prev;
  this_00->prev = pNVar2;
  this_00->next = pNVar1;
  pNVar2->next = this_00;
  pNVar1->prev = this_00;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}